

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointee_adaptor.cpp
# Opt level: O3

void __thiscall
PointeeAdaptor_Relational_Test::~PointeeAdaptor_Relational_Test
          (PointeeAdaptor_Relational_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F (PointeeAdaptor, Relational) {
    auto a = begin_;
    auto b = begin_ + 1;
    EXPECT_TRUE (b > a);
    EXPECT_FALSE (a > b);
    EXPECT_TRUE (b >= a);
    EXPECT_FALSE (a > b);
    EXPECT_TRUE (a <= b);
    EXPECT_FALSE (b <= a);
    EXPECT_TRUE (a <= a);
    EXPECT_TRUE (a >= a);
}